

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLAbstractDoubleFloat.cpp
# Opt level: O3

void __thiscall xercesc_4_0::XMLAbstractDoubleFloat::formatString(XMLAbstractDoubleFloat *this)

{
  short *psVar1;
  XMLCh *target;
  int iVar2;
  undefined4 extraout_var;
  XMLCh *pXVar3;
  long lVar4;
  
  lVar4 = 0;
  if (this->fRawData != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)this->fRawData + lVar4);
      lVar4 = lVar4 + 2;
    } while (*psVar1 != 0);
    lVar4 = (lVar4 >> 1) + -1;
  }
  iVar2 = (*this->fMemoryManager->_vptr_MemoryManager[3])();
  pXVar3 = (XMLCh *)CONCAT44(extraout_var,iVar2);
  this->fFormattedString = pXVar3;
  if (lVar4 != -8) {
    memset(pXVar3,0,lVar4 * 2 + 0x10);
  }
  XMLString::copyString(pXVar3,this->fRawData);
  target = this->fFormattedString;
  pXVar3 = target + lVar4;
  pXVar3[0] = L' ';
  pXVar3[1] = L'(';
  if ((ulong)this->fType < 3) {
    pXVar3 = (XMLCh *)(&PTR_fgNegINFString_00401f60)[this->fType];
  }
  else {
    pXVar3 = L"0";
  }
  XMLString::catString(target,pXVar3);
  pXVar3 = this->fFormattedString;
  lVar4 = 0;
  if (pXVar3 != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)pXVar3 + lVar4);
      lVar4 = lVar4 + 2;
    } while (*psVar1 != 0);
    lVar4 = (lVar4 >> 1) + -1;
  }
  pXVar3[lVar4] = L')';
  return;
}

Assistant:

void XMLAbstractDoubleFloat::formatString()
{

    XMLSize_t rawDataLen = XMLString::stringLen(fRawData);
    fFormattedString = (XMLCh*) fMemoryManager->allocate
    (
        (rawDataLen + 8) * sizeof(XMLCh)
    );//new XMLCh [ rawDataLen + 8];
    for (XMLSize_t i = 0; i < rawDataLen + 8; i++)
        fFormattedString[i] = chNull;

    XMLString::copyString(fFormattedString, fRawData);

    fFormattedString[rawDataLen] = chSpace;
    fFormattedString[rawDataLen + 1] = chOpenParen;

    switch (fType)
    {
    case NegINF:       
        XMLString::catString(fFormattedString, XMLUni::fgNegINFString);
        break;
    case PosINF:
        XMLString::catString(fFormattedString, XMLUni::fgPosINFString);
        break;
    case NaN:
        XMLString::catString(fFormattedString, XMLUni::fgNaNString);
        break;
    default:
        // its zero
        XMLString::catString(fFormattedString, XMLUni::fgPosZeroString);
        break;
    }

    fFormattedString[XMLString::stringLen(fFormattedString)] = chCloseParen;

}